

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall VectorLattice_GetBottom_Test::TestBody(VectorLattice_GetBottom_Test *this)

{
  initializer_list<bool> __l;
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8 [3];
  allocator<bool> local_9b;
  bool local_9a [2];
  iterator local_98;
  size_type local_90;
  vector<bool,_std::allocator<bool>_> local_88;
  Element local_60;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  undefined1 local_20 [8];
  Vector<wasm::analysis::Bool> vector;
  VectorLattice_GetBottom_Test *this_local;
  
  vector.size = (size_t)this;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::Vector
            ((Vector<wasm::analysis::Bool> *)local_20,
             (Bool *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),2);
  ::wasm::analysis::Vector<wasm::analysis::Bool>::getBottom
            (&local_60,(Vector<wasm::analysis::Bool> *)local_20);
  local_9a[0] = false;
  local_9a[1] = false;
  local_98 = local_9a;
  local_90 = 2;
  std::allocator<bool>::allocator(&local_9b);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_88,__l,&local_9b);
  testing::internal::EqHelper::
  Compare<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_38,"vector.getBottom()","(std::vector<bool>{false, false})",&local_60
             ,&local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_88);
  std::allocator<bool>::~allocator(&local_9b);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1c7,message);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(VectorLattice, GetBottom) {
  analysis::Vector<analysis::Bool> vector{analysis::Bool{}, 2};
  EXPECT_EQ(vector.getBottom(), (std::vector<bool>{false, false}));
}